

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O1

void deqp::gls::StateQueryUtil::verifyPointer
               (ResultCollector *result,QueriedState *state,void *expected)

{
  ostream *poVar1;
  ostringstream buf;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if ((state->m_type == DATATYPE_POINTER) && ((void *)(state->m_v).vInt64 != expected)) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Expected ",9);
    poVar1 = std::ostream::_M_insert<void_const*>(local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    std::ostream::_M_insert<void_const*>(poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
  }
  return;
}

Assistant:

void verifyPointer (tcu::ResultCollector& result, QueriedState& state, const void* expected)
{
	switch (state.getType())
	{
		case DATATYPE_POINTER:
		{
			if (state.getPtrAccess() != expected)
			{
				std::ostringstream buf;
				buf << "Expected " << expected << ", got " << state.getPtrAccess();
				result.fail(buf.str());
			}
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}